

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O3

int __thiscall
CumulativeCalProp::ttef_analyse_tasks_right_shift
          (CumulativeCalProp *this,int begin,int end,int dur_in,int task,int max_dur_lift,
          int *last_dur)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  int iVar13;
  
  iVar1 = (this->start).data[(uint)task]->max0;
  if (max_dur_lift < dur_in) {
    piVar12 = this->lst_2;
    iVar9 = piVar12[task];
    iVar13 = end;
    if (iVar9 < end) {
      iVar13 = iVar9;
    }
    lVar7 = (long)(this->taskCalendar).data[(uint)task];
    if (iVar13 <= begin) {
      iVar13 = begin;
    }
    piVar3 = this->lct_2;
    iVar6 = piVar3[task];
    if (end <= iVar6) {
      iVar6 = end;
    }
    if (this->rho == 1) {
      iVar6 = iVar6 - iVar13;
    }
    else {
      iVar6 = this->workingPeriods[lVar7 + -1][iVar13] - this->workingPeriods[lVar7 + -1][iVar6];
    }
    piVar4 = this->calendar[lVar7 + -1];
    *last_dur = iVar6;
    uVar2 = piVar12[task];
    uVar10 = (ulong)uVar2;
    if ((int)uVar2 < iVar1) {
      iVar13 = piVar3[task];
      do {
        iVar6 = iVar6 - (uint)(begin <= iVar9);
        iVar8 = (int)uVar10;
        if (piVar4[(long)iVar8 + 1] == 0) {
          uVar10 = (long)iVar8 + 1;
          do {
            uVar11 = uVar10;
            iVar6 = iVar6 - (uint)((long)begin <= (long)uVar11 && this->rho == 1);
            uVar10 = uVar11 + 1;
            if ((long)iVar1 <= (long)uVar11) break;
          } while (piVar4[uVar11 + 1] == 0);
          if ((long)iVar1 <= (long)uVar11) {
            return iVar9;
          }
        }
        else {
          uVar10 = (ulong)(iVar8 + 1);
        }
        iVar8 = iVar13 + 1;
        iVar5 = iVar13;
        if (piVar4[iVar13] == 0) {
          piVar12 = piVar4 + (iVar13 + 1);
          do {
            iVar5 = iVar13;
            iVar6 = iVar6 + (uint)(iVar5 < end && this->rho == 1);
            iVar8 = *piVar12;
            piVar12 = piVar12 + 1;
            iVar13 = iVar5 + 1;
          } while (iVar8 == 0);
          iVar8 = iVar5 + 2;
          iVar5 = iVar5 + 1;
        }
        iVar13 = iVar8;
        iVar6 = (uint)(iVar5 < end) + iVar6;
        if (iVar6 < dur_in - max_dur_lift) {
          return iVar9;
        }
        *last_dur = iVar6;
        iVar9 = (int)uVar10;
      } while (iVar9 < iVar1);
    }
  }
  else {
    *last_dur = 0;
    iVar9 = iVar1;
  }
  return iVar9;
}

Assistant:

int CumulativeCalProp::ttef_analyse_tasks_right_shift(const int begin, const int end,
																											const int dur_in, const int task,
																											const int max_dur_lift, int& last_dur) {
	// Some assumptions
	assert(est_2[task] < end && begin < lct_2[task]);

	// Defining some constants
	const int lst0 = max_start0(task);
	if (dur_in <= max_dur_lift) {
		last_dur = 0;
		return lst0;
	}
	// Defining more constants
	const int cal_idx = taskCalendar[task] - 1;
	const int* wPeriods = workingPeriods[cal_idx];
	const int* tCal = calendar[cal_idx];
	const int min_dur_in = dur_in - max_dur_lift;
	const int begin_in = std::max(begin, std::min(lst_2[task], end));
	const int end_in = std::min(lct_2[task], end);
	// Defining some variables
	int workDays = (rho == 1 ? end_in - begin_in : wPeriods[begin_in] - wPeriods[end_in]);
	int last_lst = lst_2[task];
	last_dur = workDays;
	int lst = lst_2[task] + 1;
	int lct = lct_2[task] + 1;

	assert(workDays >= dur_in);

	// Determining the latest possible start time and the number of workDays in the time window
	// [begin, end)
	for (; lst <= lst0; lst++, lct++) {
		if (last_lst >= begin) {
			workDays--;
		}
		// Determining the new start time
		assert(tCal[lst - 1] == 1);
		while (tCal[lst] == 0 && lst <= lst0) {
			if (rho == 1 && lst >= begin) {
				workDays--;
			}
			lst++;
		}
		if (lst > lst0) {
			return last_lst;
		}
		// Determining the new end time
		assert(tCal[lct - 2] == 1);
		while (tCal[lct - 1] == 0) {
			if (rho == 1 && lct <= end) {
				workDays++;
			}
			lct++;
		}
		if (lct <= end) {
			workDays++;
		}
		// Check the number of working days in the time window [begin, end)
		if (workDays < min_dur_in) {
			return last_lst;
		}
		// Saving valid shift
		last_lst = lst;
		last_dur = workDays;

		// Some cross checks
		assert(min_dur(task) == wPeriods[last_lst] - wPeriods[lct]);
		assert(rho == 0 || workDays == std::min(end, lct) - std::max(begin, last_lst));
		assert(rho == 1 ||
					 workDays == wPeriods[std::max(begin, last_lst)] - wPeriods[std::min(end, lct)]);
		assert(ttef_analyse_tasks_check_expl_ub(begin, end, task, min_dur_in, last_lst));
	}
	return last_lst;
}